

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_io.cc
# Opt level: O0

void __thiscall gimage::RAWImageIO::save(RAWImageIO *this,ImageU16 *image,char *name)

{
  char cVar1;
  int iVar2;
  ulong uVar3;
  undefined8 uVar4;
  long lVar5;
  char *in_RDX;
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *in_RSI;
  long *in_RDI;
  failure *ex;
  store_t_conflict p;
  long i;
  long k;
  streambuf *sb;
  ofstream out;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffca0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffca8;
  byte local_331;
  string *in_stack_fffffffffffffcd8;
  IOException *in_stack_fffffffffffffce0;
  long local_2a8;
  long local_2a0;
  long local_290 [7];
  long in_stack_fffffffffffffda8;
  long in_stack_fffffffffffffdb0;
  int in_stack_fffffffffffffdbc;
  char *in_stack_fffffffffffffdc0;
  allocator local_79;
  string local_78 [96];
  char *local_18;
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  uVar3 = (**(code **)(*in_RDI + 0x18))(in_RDI,in_RDX,0);
  if (((uVar3 & 1) != 0) &&
     (iVar2 = Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::getDepth(local_10),
     iVar2 == 1)) {
    Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::getWidth(local_10);
    Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::getHeight(local_10);
    anon_unknown_8::writeRAWHeader
              (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb0,
               in_stack_fffffffffffffda8);
    std::ofstream::ofstream(local_290);
    uVar4 = *(undefined8 *)(local_290[0] + -0x18);
    std::operator|(_S_failbit,_S_badbit);
    std::ios::exceptions((int)local_290 + (int)uVar4);
    std::ofstream::open((char *)local_290,(_Ios_Openmode)local_18);
    cVar1 = std::ofstream::rdbuf();
    local_2a0 = 0;
    while( true ) {
      lVar5 = Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::getHeight(local_10);
      local_331 = 0;
      if (local_2a0 < lVar5) {
        local_331 = std::ios::good();
      }
      if ((local_331 & 1) == 0) break;
      for (local_2a8 = 0;
          lVar5 = Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::getWidth(local_10),
          local_2a8 < lVar5; local_2a8 = local_2a8 + 1) {
        Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::get
                  (local_10,local_2a8,local_2a0,0);
        std::streambuf::sputc(cVar1);
        std::streambuf::sputc(cVar1);
      }
      local_2a0 = local_2a0 + 1;
    }
    std::ofstream::close();
    std::ofstream::~ofstream(local_290);
    return;
  }
  uVar4 = __cxa_allocate_exception(0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,local_18,&local_79);
  std::operator+((char *)in_stack_fffffffffffffca8,in_stack_fffffffffffffca0);
  std::operator+(in_stack_fffffffffffffca8,(char *)in_stack_fffffffffffffca0);
  gutil::IOException::IOException(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
  __cxa_throw(uVar4,&gutil::IOException::typeinfo,gutil::IOException::~IOException);
}

Assistant:

void RAWImageIO::save(const ImageU16 &image, const char *name) const
{
  if (!handlesFile(name, false) || image.getDepth() != 1)
  {
    throw gutil::IOException("Can only save RAW images with depth 1 ("+std::string(name)+")");
  }

  writeRAWHeader(name, 2, image.getWidth(), image.getHeight());

  try
  {
    std::ofstream out;
    out.exceptions(std::ios_base::failbit | std::ios_base::badbit);
    out.open(name, std::ios::binary);

    std::streambuf *sb=out.rdbuf();

    for (long k=0; k<image.getHeight() && out.good(); k++)
    {
      for (long i=0; i<image.getWidth(); i++)
      {
        ImageU16::store_t p=image.get(i, k);

        sb->sputc(static_cast<char>(p&0xff));
        sb->sputc(static_cast<char>((p>>8)&0xff));
      }
    }

    out.close();
  }
  catch (const std::ios_base::failure &ex)
  {
    throw gutil::IOException(ex.what());
  }
}